

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

sexp_conflict
sexp_thread_terminate(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict thread)

{
  int iVar1;
  sexp_conflict psVar2;
  sexp_conflict n_00;
  sexp_conflict extraout_RDX;
  bool bVar3;
  
  bVar3 = ctx == thread;
  if ((((ulong)thread & 3) == 0) && (thread->tag == 0x24)) {
    for (; ((thread != (sexp_conflict)0x0 && (((ulong)thread & 3) == 0)) && (thread->tag == 0x24));
        thread = (thread->value).type.getters) {
      if (0 < (ctx->value).context.refuel) {
        (thread->value).flonum_bits[0x60a4] = '\x01';
        (thread->value).context.result =
             (sexp)(((ctx->value).type.setters)->value).context.mark_stack[9].start;
        (thread->value).context.refuel = 0;
      }
      iVar1 = sexp_delete_list(ctx,(int)thread,(sexp_conflict)n);
      n = (sexp_sint_t)n_00;
      if (iVar1 != 0) {
        sexp_thread_start(ctx,self,(sexp_sint_t)n_00,thread);
        n = (sexp_sint_t)extraout_RDX;
      }
    }
    return (sexp_conflict)((ulong)bVar3 << 8 | 0x3e);
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,0x24,thread);
  return psVar2;
}

Assistant:

sexp sexp_thread_terminate (sexp ctx, sexp self, sexp_sint_t n, sexp thread) {
  sexp res = sexp_make_boolean(ctx == thread);
  sexp_assert_type(ctx, sexp_contextp, SEXP_CONTEXT, thread);
  /* terminate the thread and all children */
  for ( ; thread && sexp_contextp(thread); thread=sexp_context_child(thread)) {
    /* if not already terminated set an exception status */
    if (sexp_context_refuel(ctx) > 0) {
      sexp_context_errorp(thread) = 1;
      sexp_context_result(thread) =
        sexp_global(ctx, SEXP_G_THREAD_TERMINATE_ERROR);
      /* zero the refuel - this tells the scheduler the thread is terminated */
      sexp_context_refuel(thread) = 0;
    }
    /* unblock the thread if needed so it can be scheduled and terminated */
    if (sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, thread))
      sexp_thread_start(ctx, self, 1, thread);
  }
  /* return true if terminating self, then we can yield */
  return res;
}